

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O0

void __thiscall
Secp256k1_AddTweakPubkeySecp256k1EcErrorTest_Test::TestBody
          (Secp256k1_AddTweakPubkeySecp256k1EcErrorTest_Test *this)

{
  bool bVar1;
  reference paVar2;
  ulong uVar3;
  AssertHelper local_140;
  Message local_138 [2];
  CfdException *anon_var_0_1;
  ByteData actual_1;
  char *pcStack_108;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  Message local_f8 [2];
  CfdException *anon_var_0;
  undefined1 local_e0 [8];
  ByteData actual;
  bool gtest_caught_expected;
  ConstCharPtr local_b8;
  ConstCharPtr gtest_msg;
  TweakPubkeyTestVector test_vector;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TweakPubkeyTestVector,_std::allocator<TweakPubkeyTestVector>_> *__range1;
  Secp256k1 secp;
  secp256k1_context_struct *cxt;
  Secp256k1_AddTweakPubkeySecp256k1EcErrorTest_Test *this_local;
  
  secp.secp256k1_context_ = wally_get_secp_context();
  cfd::core::Secp256k1::Secp256k1((Secp256k1 *)&__range1,secp.secp256k1_context_);
  __end1 = std::vector<TweakPubkeyTestVector,_std::allocator<TweakPubkeyTestVector>_>::begin
                     (&tweak_pubkey_error_vectors);
  test_vector.expect_mul.field_2._8_8_ =
       std::vector<TweakPubkeyTestVector,_std::allocator<TweakPubkeyTestVector>_>::end
                 (&tweak_pubkey_error_vectors);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_TweakPubkeyTestVector_*,_std::vector<TweakPubkeyTestVector,_std::allocator<TweakPubkeyTestVector>_>_>
                                *)((long)&test_vector.expect_mul.field_2 + 8));
    if (!bVar1) {
      return;
    }
    paVar2 = __gnu_cxx::
             __normal_iterator<const_TweakPubkeyTestVector_*,_std::vector<TweakPubkeyTestVector,_std::allocator<TweakPubkeyTestVector>_>_>
             ::operator*(&__end1);
    anon_struct_120_5_2a4d6406::TweakPubkeyTestVector
              ((anon_struct_120_5_2a4d6406 *)&gtest_msg,paVar2);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      testing::internal::ConstCharPtr::ConstCharPtr(&local_b8,"");
      bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_b8);
      if (bVar1) {
        actual.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
        bVar1 = testing::internal::AlwaysTrue();
        if (bVar1) {
          cfd::core::Secp256k1::AddTweakPubkeySecp256k1Ec
                    ((ByteData *)local_e0,(Secp256k1 *)&__range1,(ByteData *)&gtest_msg,
                     (ByteData *)
                     &test_vector.pubkey.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (bool)((byte)test_vector.tweak.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage & 1));
          cfd::core::ByteData::~ByteData((ByteData *)local_e0);
        }
        if ((actual.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) goto LAB_004c66de;
        local_b8.value =
             "Expected: ByteData actual = secp.AddTweakPubkeySecp256k1Ec(test_vector.pubkey, test_vector.tweak, test_vector.is_check) throws an exception of type CfdException.\n  Actual: it throws nothing."
        ;
      }
      testing::Message::Message(local_f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_msg_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                 ,0x108,local_b8.value);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_1,local_f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_1);
      testing::Message::~Message(local_f8);
    }
LAB_004c66de:
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffef8,"");
      bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                        ((ConstCharPtr *)&stack0xfffffffffffffef8);
      if (bVar1) {
        actual_1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        bVar1 = testing::internal::AlwaysTrue();
        if (bVar1) {
          cfd::core::Secp256k1::MulTweakPubkeySecp256k1Ec
                    ((ByteData *)&anon_var_0_1,(Secp256k1 *)&__range1,(ByteData *)&gtest_msg,
                     (ByteData *)
                     &test_vector.pubkey.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          cfd::core::ByteData::~ByteData((ByteData *)&anon_var_0_1);
        }
        if ((actual_1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) goto LAB_004c68bb;
        pcStack_108 = 
        "Expected: ByteData actual = secp.MulTweakPubkeySecp256k1Ec(test_vector.pubkey, test_vector.tweak) throws an exception of type CfdException.\n  Actual: it throws nothing."
        ;
      }
      testing::Message::Message(local_138);
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                 ,0x10e,pcStack_108);
      testing::internal::AssertHelper::operator=(&local_140,local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      testing::Message::~Message(local_138);
    }
LAB_004c68bb:
    anon_struct_120_5_2a4d6406::~TweakPubkeyTestVector((anon_struct_120_5_2a4d6406 *)&gtest_msg);
    __gnu_cxx::
    __normal_iterator<const_TweakPubkeyTestVector_*,_std::vector<TweakPubkeyTestVector,_std::allocator<TweakPubkeyTestVector>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

TEST(Secp256k1, AddTweakPubkeySecp256k1EcErrorTest) {
  struct secp256k1_context_struct *cxt = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(cxt);
  for (TweakPubkeyTestVector test_vector : tweak_pubkey_error_vectors) {
    if (test_vector.expect_add.empty()) {
      EXPECT_THROW(
        ByteData actual = secp.AddTweakPubkeySecp256k1Ec(test_vector.pubkey,
          test_vector.tweak, test_vector.is_check),
        CfdException);
    }
    if (test_vector.expect_mul.empty()) {
      EXPECT_THROW(
        ByteData actual = secp.MulTweakPubkeySecp256k1Ec(test_vector.pubkey,
          test_vector.tweak),
        CfdException);
    }
  }
}